

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O1

int __thiscall GEO::geofile::scale_data(geofile *this,double factor)

{
  _Rb_tree_node_base *p_Var1;
  bool local_11;
  double local_10;
  
  local_11 = true;
  local_10 = factor;
  make_coherent(this,&local_11);
  simplify_data(this);
  for (p_Var1 = (this->points_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->points_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    p_Var1[1]._M_parent = (_Base_ptr)((double)p_Var1[1]._M_parent * local_10);
    p_Var1[1]._M_left = (_Base_ptr)((double)p_Var1[1]._M_left * local_10);
    p_Var1[1]._M_right = (_Base_ptr)((double)p_Var1[1]._M_right * local_10);
  }
  return 0;
}

Assistant:

int GEO::geofile::scale_data(const double factor)
{
    make_coherent(true);
    simplify_data();
    auto pm_end = points_map.end();
    for (auto i = points_map.begin(); i != pm_end; i++)
    {
        scale_point(i->second, factor);
    }
    return EXIT_SUCCESS;
}